

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

void __thiscall Wasm::WasmBinaryReader::ReadElementSection(WasmBinaryReader *this)

{
  code *pcVar1;
  WasmNode initExpr_00;
  bool bVar2;
  uint uVar3;
  uint sourceContextId;
  uint numElem;
  Type funcType;
  undefined4 *puVar4;
  WasmElementSegment *this_00;
  char16_t *pcVar5;
  WasmBinaryReader *pWVar6;
  FunctionBody *pFVar7;
  uint32 index;
  ulong uVar8;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 auStack_60 [8];
  WasmNode initExpr;
  uint32 local_38;
  uint local_34;
  uint32 length;
  
  local_38 = 0;
  pWVar6 = this;
  uVar3 = LEB128<unsigned_int,32u>(this,&local_38);
  if ((10000000 < uVar3) && (DAT_015aa2e2 == '\0')) {
    pcVar5 = L"Too many element segments";
LAB_00f26698:
    ThrowDecodingError(pWVar6,pcVar5);
  }
  if (uVar3 != 0) {
    Js::WebAssemblyModule::AllocateElementSegs(this->m_module,uVar3);
  }
  pFVar7 = (this->m_funcState).body;
  if (pFVar7 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,WasmReaderPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar7);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar7 = (this->m_funcState).body;
    }
    else {
      pFVar7 = (FunctionBody *)0x0;
    }
    if ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015cd718,WasmReaderPhase,sourceContextId,
                       ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->functionId);
  }
  if (bVar2 != false) {
    Output::Print(L"Indirect table element: %u entries",(ulong)uVar3);
    Output::Print(L"\n");
    Output::Flush();
  }
  if (uVar3 != 0) {
    uVar8 = 0;
    local_34 = uVar3;
    do {
      pWVar6 = this;
      uVar3 = LEB128<unsigned_int,32u>(this,&local_38);
      if ((uVar3 != 0) ||
         (((this->m_module->field_0x20 & 1) == 0 &&
          ((this->m_module->m_tableImport).ptr == (WasmImport *)0x0)))) {
        pcVar5 = L"Unknown table index %d";
LAB_00f2667f:
        ThrowDecodingError(pWVar6,pcVar5,(ulong)uVar3);
      }
      initExpr.field_1._16_8_ = uVar8;
      ReadInitExpr((WasmNode *)auStack_60,this,true);
      pWVar6 = this;
      numElem = LEB128<unsigned_int,32u>(this,&local_38);
      if ((DAT_015aa2e2 == '\0') && (DAT_015aa2e8 < numElem)) {
        pcVar5 = L"Too many table element";
        goto LAB_00f26698;
      }
      this_00 = (WasmElementSegment *)new<Memory::ArenaAllocator>(0x48,this->m_alloc,0x366bee);
      initExpr_00.field_1.block = initExpr.field_1.block;
      initExpr_00.op = initExpr.op;
      initExpr_00._2_6_ = initExpr._2_6_;
      initExpr_00.field_1.brTable.targetTable = initExpr.field_1.brTable.targetTable;
      initExpr_00.field_1._16_8_ = in_stack_ffffffffffffff98;
      WasmElementSegment::WasmElementSegment(this_00,this->m_alloc,0,initExpr_00,numElem);
      for (; numElem != 0; numElem = numElem - 1) {
        uVar3 = LEB128<unsigned_int,32u>(this,&local_38);
        funcType = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,uVar3);
        pWVar6 = (WasmBinaryReader *)(ulong)(uint)funcType;
        bVar2 = FunctionIndexTypes::CanBeExported(funcType);
        if (!bVar2) {
          pcVar5 = L"Invalid function to insert in the table %u";
          goto LAB_00f2667f;
        }
        WasmElementSegment::AddElement(this_00,uVar3);
      }
      index = (uint32)initExpr.field_1._16_8_;
      Js::WebAssemblyModule::SetElementSeg(this->m_module,this_00,index);
      uVar3 = index + 1;
      uVar8 = (ulong)uVar3;
    } while (uVar3 != local_34);
  }
  return;
}

Assistant:

void WasmBinaryReader::ReadElementSection()
{
    uint32 length = 0;
    uint32 numSegments = LEB128(length);
    if (numSegments > Limits::GetMaxElementSegments())
    {
        ThrowDecodingError(_u("Too many element segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateElementSegs(numSegments);
    }
    TRACE_WASM_DECODER(_u("Indirect table element: %u entries"), numSegments);

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(length); // Table id
        if (index != 0 || !(m_module->HasTable() || m_module->HasTableImport()))
        {
            ThrowDecodingError(_u("Unknown table index %d"), index); //MVP limitation
        }

        WasmNode initExpr = ReadInitExpr(true);
        uint32 numElem = LEB128(length);

        if (numElem > Limits::GetMaxTableSize())
        {
            ThrowDecodingError(_u("Too many table element"));
        }

        WasmElementSegment* eSeg = Anew(m_alloc, WasmElementSegment, m_alloc, index, initExpr, numElem);

        for (uint32 iElem = 0; iElem < numElem; ++iElem)
        {
            uint32 elem = LEB128(length);
            FunctionIndexTypes::Type funcType = m_module->GetFunctionIndexType(elem);
            if (!FunctionIndexTypes::CanBeExported(funcType))
            {
                ThrowDecodingError(_u("Invalid function to insert in the table %u"), elem);
            }
            eSeg->AddElement(elem);
        }
        m_module->SetElementSeg(eSeg, i);
    }
}